

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O0

Belief * __thiscall
despot::SimpleRockSample::InitialBelief(SimpleRockSample *this,State *start,string *type)

{
  bool bVar1;
  ParticleBelief *pPVar2;
  ostream *poVar3;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_80;
  value_type local_68;
  value_type local_60;
  SimpleState *bad_rock;
  SimpleState *local_40;
  SimpleState *good_rock;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  string *type_local;
  State *start_local;
  SimpleRockSample *this_local;
  
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)type;
  bVar1 = std::operator==(type,"DEFAULT");
  if (!bVar1) {
    bVar1 = std::operator==(type,"PARTICLE");
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "[SimpleRockSample::InitialBelief] Unsupported belief type: ");
      poVar3 = std::operator<<(poVar3,(string *)type);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
  }
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&good_rock);
  bad_rock = (SimpleState *)(**(code **)(*(long *)this + 0xa8))(0x3fe0000000000000,this,0xffffffff);
  bad_rock->rover_position = 1;
  bad_rock->rock_status = 1;
  local_40 = bad_rock;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&good_rock,
             (value_type *)&bad_rock);
  local_68 = (value_type)(**(code **)(*(long *)this + 0xa8))(0x3fe0000000000000,this,0xffffffff);
  *(undefined4 *)(local_68 + 0x20) = 1;
  *(undefined4 *)(local_68 + 0x24) = 0;
  local_60 = local_68;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&good_rock,&local_68);
  pPVar2 = (ParticleBelief *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            (&local_80,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)&good_rock);
  despot::ParticleBelief::ParticleBelief(pPVar2,&local_80,this,0,1);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_80);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&good_rock);
  return (Belief *)pPVar2;
}

Assistant:

Belief* SimpleRockSample::InitialBelief(const State* start, string type) const {
	if (type == "DEFAULT" || type == "PARTICLE") {
		vector<State*> particles;

		SimpleState* good_rock = static_cast<SimpleState*>(Allocate(-1, 0.5));
		good_rock->rover_position = MIDDLE;
		good_rock->rock_status = O_GOOD;
		particles.push_back(good_rock);

		SimpleState* bad_rock = static_cast<SimpleState*>(Allocate(-1, 0.5));
		bad_rock->rover_position = MIDDLE;
		bad_rock->rock_status = O_BAD;
		particles.push_back(bad_rock);

		return new ParticleBelief(particles, this);
	} else {
		cerr << "[SimpleRockSample::InitialBelief] Unsupported belief type: " << type << endl;
		exit(1);
	}
}